

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O0

size_t ptls_asn1_read_length
                 (uint8_t *bytes,size_t bytes_max,size_t byte_index,uint32_t *length,
                 int *indefinite_length,size_t *last_byte,int *decode_error,int level,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  uint uVar1;
  int local_40;
  int i;
  int length_of_length;
  size_t *last_byte_local;
  int *indefinite_length_local;
  uint32_t *length_local;
  size_t byte_index_local;
  size_t bytes_max_local;
  uint8_t *bytes_local;
  
  *indefinite_length = 0;
  *length = 0;
  *last_byte = bytes_max;
  length_local = (uint32_t *)byte_index;
  if (byte_index < bytes_max) {
    length_local = (uint32_t *)(byte_index + 1);
    *length = (uint)bytes[byte_index];
    if ((*length & 0x80) == 0) {
      *last_byte = (long)length_local + (ulong)*length;
    }
    else {
      uVar1 = *length & 0x7f;
      *length = 0;
      if ((ulong)((long)length_local + (long)(int)uVar1) < bytes_max) {
        for (local_40 = 0; local_40 < (int)uVar1 && length_local < bytes_max;
            local_40 = local_40 + 1) {
          *length = *length << 8;
          *length = (uint)bytes[(long)length_local] | *length;
          length_local = (uint32_t *)((long)length_local + 1);
        }
        if (uVar1 == 0) {
          *last_byte = bytes_max;
          *indefinite_length = 1;
        }
        else {
          *last_byte = (long)length_local + (ulong)*length;
        }
      }
      else {
        length_local = (uint32_t *)
                       ptls_asn1_error_message
                                 ("Incorrect length coding",bytes_max,(size_t)length_local,level,
                                  log_ctx);
        *decode_error = 0x236;
      }
    }
    if ((*decode_error == 0) && (bytes_max < *last_byte)) {
      length_local = (uint32_t *)
                     ptls_asn1_error_message
                               ("Length larger than message",bytes_max,(size_t)length_local,level,
                                log_ctx);
      *decode_error = 0x237;
    }
  }
  return (size_t)length_local;
}

Assistant:

size_t ptls_asn1_read_length(const uint8_t *bytes, size_t bytes_max, size_t byte_index, uint32_t *length, int *indefinite_length,
                             size_t *last_byte, int *decode_error, int level, ptls_minicrypto_log_ctx_t *log_ctx)
{
    int length_of_length = 0;

    *indefinite_length = 0;
    *length = 0;
    *last_byte = bytes_max;

    if (byte_index < bytes_max) {
        *length = bytes[byte_index++];
        if ((*length & 128) != 0) {
            length_of_length = *length & 127;
            *length = 0;

            if (byte_index + length_of_length >= bytes_max) {
                /* This is an error */
                byte_index = ptls_asn1_error_message("Incorrect length coding", bytes_max, byte_index, level, log_ctx);
                *decode_error = PTLS_ERROR_BER_MALFORMED_LENGTH;
            } else {
                for (int i = 0; i < length_of_length && byte_index < bytes_max; i++) {
                    *length <<= 8;
                    *length |= bytes[byte_index++];
                }

                if (length_of_length == 0) {
                    *last_byte = bytes_max;
                    *indefinite_length = 1;
                } else {
                    *last_byte = byte_index + *length;
                }
            }
        } else {
            *last_byte = byte_index + *length;
        }

        if (*decode_error == 0) {
            /* TODO: verify that the length makes sense */
            if (*last_byte > bytes_max) {
                byte_index = ptls_asn1_error_message("Length larger than message", bytes_max, byte_index, level, log_ctx);
                *decode_error = PTLS_ERROR_BER_EXCESSIVE_LENGTH;
            }
        }
    }

    return byte_index;
}